

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall mxx::rangebuf::rangebuf(rangebuf *this,streampos start,size_t size,streambuf *sbuf)

{
  char *pcVar1;
  streambuf *sbuf_local;
  size_t size_local;
  rangebuf *this_local;
  streampos start_local;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__rangebuf_001ab338;
  this->size_ = size;
  this->sbuf_ = sbuf;
  pcVar1 = (char *)operator_new__(0x40);
  this->buf_ = pcVar1;
  std::streambuf::pubseekpos(sbuf,start._M_off,start._M_state,8);
  return;
}

Assistant:

rangebuf(std::streampos start,
                    size_t size,
                    std::streambuf* sbuf):
        size_(size), sbuf_(sbuf), buf_(new char[64])
    {
        sbuf->pubseekpos(start, std::ios_base::in);
    }